

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderError1InputBlocks::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError1InputBlocks *this,
          uint n_program_object)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices=4) out;\n\nin IN_TC\n{\n    vec4 test_block_field;\n} test_block;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = test_block.test_block_field;\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n    gl_TessLevelOuter[2]                = 1.0;\n    gl_TessLevelOuter[3]                = 1.0;\n    gl_TessLevelInner[0]                = 1.0;\n    gl_TessLevelInner[1]                = 1.0;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError1InputBlocks::getTessellationControlShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (vertices=4) out;\n"
		   "\n"
		   /* Invalid input block declaration */
		   "in IN_TC\n"
		   "{\n"
		   "    vec4 test_block_field;\n"
		   "} test_block;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_out[gl_InvocationID].gl_Position = test_block.test_block_field;\n"
		   "    gl_TessLevelOuter[0]                = 1.0;\n"
		   "    gl_TessLevelOuter[1]                = 1.0;\n"
		   "    gl_TessLevelOuter[2]                = 1.0;\n"
		   "    gl_TessLevelOuter[3]                = 1.0;\n"
		   "    gl_TessLevelInner[0]                = 1.0;\n"
		   "    gl_TessLevelInner[1]                = 1.0;\n"
		   "}\n";
}